

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O2

void __thiscall
CircularArrayTest_const_operator_brackets_Test::~CircularArrayTest_const_operator_brackets_Test
          (CircularArrayTest_const_operator_brackets_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CircularArrayTest, const_operator_brackets) {
  CircularArray<TestObject, 2> ca;
  const auto& cca = ca;

  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));

  ASSERT_EQ(1, cca[0].data);
  ASSERT_EQ(2, cca[1].data);
}